

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

void cconv_substruct_init(CTState *cts,CType *d,uint8_t *dp,TValue *o,MSize len,MSize *ip)

{
  ushort uVar1;
  uint uVar2;
  CTState *in_RCX;
  CType *in_RDX;
  CTState *in_RSI;
  TValue *in_RDI;
  uint in_R8D;
  uint *in_R9;
  MSize i;
  CType *df;
  CTypeID id;
  undefined4 in_stack_ffffffffffffff28;
  uint flags;
  undefined4 in_stack_ffffffffffffff38;
  CTState *in_stack_ffffffffffffff70;
  TValue *in_stack_ffffffffffffff78;
  CTState *in_stack_ffffffffffffff80;
  CTState *local_60;
  
  uVar2 = (uint)(ushort)in_RSI->top;
  do {
    do {
      while( true ) {
        flags = uVar2;
        if (flags == 0) {
          return;
        }
        local_60 = (CTState *)(in_RDI->u64 + (ulong)flags * 0x10);
        uVar1 = (ushort)local_60->top;
        uVar2 = (uint)uVar1;
        if ((*(uint *)&local_60->tab >> 0x1c == 9) || (*(uint *)&local_60->tab >> 0x1c == 10))
        break;
        if (((ulong)local_60->tab & 0xf0ff0000) == 0x80030000) {
          do {
            in_stack_ffffffffffffff80 = local_60;
            in_stack_ffffffffffffff70 =
                 (CTState *)
                 (in_RDI->u64 + (ulong)(*(uint *)&in_stack_ffffffffffffff80->tab & 0xffff) * 0x10);
            local_60 = in_stack_ffffffffffffff70;
          } while (*(uint *)&in_stack_ffffffffffffff70->tab >> 0x1c == 8);
          in_stack_ffffffffffffff78 = in_RDI;
          cconv_substruct_init
                    (in_RSI,in_RDX,(uint8_t *)in_RCX,
                     (TValue *)CONCAT44(in_R8D,in_stack_ffffffffffffff38),
                     (MSize)((ulong)in_R9 >> 0x20),
                     (MSize *)(ulong)CONCAT24(uVar1,in_stack_ffffffffffffff28));
          if (((ulong)in_RSI->tab & 0x800000) != 0) {
            return;
          }
        }
      }
    } while (local_60->sizetab == 0);
    if (in_R8D <= *in_R9) {
      return;
    }
    *in_R9 = *in_R9 + 1;
    if (*(uint *)&local_60->tab >> 0x1c == 9) {
      do {
        local_60 = (CTState *)(in_RDI->u64 + (ulong)(*(uint *)&local_60->tab & 0xffff) * 0x10);
      } while (*(uint *)&local_60->tab >> 0x1c == 8);
      lj_cconv_ct_tv(in_stack_ffffffffffffff80,(CType *)&in_stack_ffffffffffffff78->field_2,
                     (uint8_t *)in_stack_ffffffffffffff70,in_RDI,flags);
    }
    else {
      lj_cconv_bf_tv(in_RCX,(CType *)CONCAT44(in_R8D,in_stack_ffffffffffffff38),(uint8_t *)in_R9,
                     (TValue *)(ulong)CONCAT24(uVar1,in_stack_ffffffffffffff28));
    }
  } while (((ulong)in_RSI->tab & 0x800000) == 0);
  return;
}

Assistant:

static void cconv_substruct_init(CTState *cts, CType *d, uint8_t *dp,
				 TValue *o, MSize len, MSize *ip)
{
  CTypeID id = d->sib;
  while (id) {
    CType *df = ctype_get(cts, id);
    id = df->sib;
    if (ctype_isfield(df->info) || ctype_isbitfield(df->info)) {
      MSize i = *ip;
      if (!gcref(df->name)) continue;  /* Ignore unnamed fields. */
      if (i >= len) break;
      *ip = i + 1;
      if (ctype_isfield(df->info))
	lj_cconv_ct_tv(cts, ctype_rawchild(cts, df), dp+df->size, o + i, 0);
      else
	lj_cconv_bf_tv(cts, df, dp+df->size, o + i);
      if ((d->info & CTF_UNION)) break;
    } else if (ctype_isxattrib(df->info, CTA_SUBTYPE)) {
      cconv_substruct_init(cts, ctype_rawchild(cts, df),
			   dp+df->size, o, len, ip);
      if ((d->info & CTF_UNION)) break;
    }  /* Ignore all other entries in the chain. */
  }
}